

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O3

void __thiscall
llvm::DWARFDebugNames::ValueIterator::ValueIterator
          (ValueIterator *this,DWARFDebugNames *AccelTable,StringRef Key)

{
  char *pcVar1;
  
  pcVar1 = Key.Data;
  this->CurrentIndex =
       (NameIndex *)
       (AccelTable->NameIndices).super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
       super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
       super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.super_SmallVectorBase
       .BeginX;
  this->IsLocal = false;
  (this->CurrentEntry).Storage.field_0.empty = '\0';
  (this->CurrentEntry).Storage.hasVal = false;
  this->DataOffset = 0;
  (this->Key)._M_dataplus._M_p = (pointer)&(this->Key).field_2;
  if (pcVar1 == (char *)0x0) {
    (this->Key)._M_string_length = 0;
    (this->Key).field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&this->Key,pcVar1,pcVar1 + Key.Length)
    ;
  }
  (this->Hash).Storage.field_0.empty = '\0';
  (this->Hash).Storage.hasVal = false;
  searchFromStartOfCurrentIndex(this);
  return;
}

Assistant:

DWARFDebugNames::ValueIterator::ValueIterator(const DWARFDebugNames &AccelTable,
                                              StringRef Key)
    : CurrentIndex(AccelTable.NameIndices.begin()), IsLocal(false), Key(Key) {
  searchFromStartOfCurrentIndex();
}